

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O3

int Abc_NtkRetimeMinArea
              (Abc_Ntk_t *pNtk,int fForwardOnly,int fBackwardOnly,int fUseOldNames,int fVerbose)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Vec_Int_t *vValues;
  Vec_Int_t *vValues_00;
  Abc_Ntk_t *pNtkTop;
  
  if (fBackwardOnly != 0 && fForwardOnly != 0) {
    __assert_fail("!fForwardOnly || !fBackwardOnly",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retArea.c"
                  ,0x3b,"int Abc_NtkRetimeMinArea(Abc_Ntk_t *, int, int, int, int)");
  }
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retArea.c"
                  ,0x3d,"int Abc_NtkRetimeMinArea(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar1 = pNtk->nObjCounts[8];
  if (iVar1 != pNtk->vBoxes->nSize) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == Vec_PtrSize(pNtk->vBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retArea.c"
                  ,0x3e,"int Abc_NtkRetimeMinArea(Abc_Ntk_t *, int, int, int, int)");
  }
  Abc_NtkOrderCisCos(pNtk);
  if (fBackwardOnly == 0) {
    do {
      pAVar3 = Abc_NtkRetimeMinAreaOne(pNtk,1,fUseOldNames,fVerbose);
    } while (pAVar3 != (Abc_Ntk_t *)0x0);
  }
  vValues = Abc_NtkCollectLatchValues(pNtk);
  if (fForwardOnly == 0) {
    pAVar3 = Abc_NtkRetimeMinAreaOne(pNtk,0,fUseOldNames,fVerbose);
    if (pAVar3 != (Abc_Ntk_t *)0x0) {
      pNtkTop = (Abc_Ntk_t *)0x0;
      do {
        pNtkTop = Abc_NtkAttachBottom(pNtkTop,pAVar3);
        pAVar3 = Abc_NtkRetimeMinAreaOne(pNtk,0,fUseOldNames,fVerbose);
      } while (pAVar3 != (Abc_Ntk_t *)0x0);
      vValues_00 = Abc_NtkRetimeInitialValues(pNtkTop,vValues,fVerbose);
      if (pNtkTop != (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(pNtkTop);
      }
      goto LAB_008e30ef;
    }
  }
  vValues_00 = Abc_NtkRetimeInitialValues((Abc_Ntk_t *)0x0,vValues,fVerbose);
LAB_008e30ef:
  Abc_NtkInsertLatchValues(pNtk,vValues_00);
  if (vValues_00 != (Vec_Int_t *)0x0) {
    if (vValues_00->pArray != (int *)0x0) {
      free(vValues_00->pArray);
    }
    free(vValues_00);
  }
  if (vValues != (Vec_Int_t *)0x0) {
    if (vValues->pArray != (int *)0x0) {
      free(vValues->pArray);
    }
    free(vValues);
  }
  iVar2 = Abc_NtkCheck(pNtk);
  if (iVar2 == 0) {
    fwrite("Abc_NtkRetimeMinArea(): Network check has failed.\n",0x32,1,_stdout);
  }
  return iVar1 - pNtk->nObjCounts[8];
}

Assistant:

int Abc_NtkRetimeMinArea( Abc_Ntk_t * pNtk, int fForwardOnly, int fBackwardOnly, int fUseOldNames, int fVerbose )
{
    Abc_Ntk_t * pNtkTotal = NULL, * pNtkBottom;
    Vec_Int_t * vValuesNew = NULL, * vValues;
    int nLatches = Abc_NtkLatchNum(pNtk);
    int fOneFrame = 0;
    assert( !fForwardOnly || !fBackwardOnly );
    // there should not be black boxes
    assert( Abc_NtkIsSopLogic(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == Vec_PtrSize(pNtk->vBoxes) );
    // reorder CI/CO/latch inputs
    Abc_NtkOrderCisCos( pNtk );
    // perform forward retiming
    if ( !fBackwardOnly )
    {
        if ( fOneFrame )
            Abc_NtkRetimeMinAreaOne( pNtk, 1, fUseOldNames, fVerbose );
        else
            while ( Abc_NtkRetimeMinAreaOne( pNtk, 1, fUseOldNames, fVerbose ) );
    }
    // remember initial values
    vValues = Abc_NtkCollectLatchValues( pNtk );
    // perform backward retiming
    if ( !fForwardOnly )
    {
        if ( fOneFrame )
            pNtkTotal = Abc_NtkRetimeMinAreaOne( pNtk, 0, fUseOldNames, fVerbose );
        else
            while ( (pNtkBottom = Abc_NtkRetimeMinAreaOne( pNtk, 0, fUseOldNames, fVerbose )) )
                pNtkTotal = Abc_NtkAttachBottom( pNtkTotal, pNtkBottom );  
    }
    // compute initial values
    vValuesNew = Abc_NtkRetimeInitialValues( pNtkTotal, vValues, fVerbose );
    if ( pNtkTotal ) Abc_NtkDelete( pNtkTotal );
    // insert new initial values
    Abc_NtkInsertLatchValues( pNtk, vValuesNew );
    if ( vValuesNew ) Vec_IntFree( vValuesNew );
    if ( vValues )    Vec_IntFree( vValues );
    // fix the COs (this changes the circuit structure)
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeMinArea(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}